

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.c
# Opt level: O3

void parse_option(state_t *state,char *parameters)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint size_mb;
  char *pcVar4;
  
  iVar2 = strncmp(parameters,"Hash value ",0xb);
  if (iVar2 != 0) {
    return;
  }
  cVar1 = parameters[0xb];
  if ((byte)(cVar1 - 0x30U) < 10) {
    pcVar4 = parameters + 0xc;
    uVar3 = 0;
    do {
      uVar3 = (uint)(byte)(cVar1 - 0x30) + uVar3 * 10;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
    size_mb = 0x400;
    if (uVar3 < 0x400) {
      size_mb = uVar3;
    }
    if (0 < (int)uVar3) goto LAB_00103b60;
  }
  size_mb = 1;
LAB_00103b60:
  ENGINE_resize_hashtable(state->engine,size_mb);
  return;
}

Assistant:

void parse_option(state_t *state, const char *parameters)
{
    if(strncmp(parameters, "Hash value ", 11) == 0) {
        parameters += 11;
        int size_mb = parse_int(parameters);
        if(size_mb < 1) size_mb = 1;
        else if(size_mb > 1024) size_mb = 1024;
        ENGINE_resize_hashtable(state->engine, size_mb);
    }
}